

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::SequenceConcatExpr::fromSyntax(DelayedSequenceExprSyntax *syntax,ASTContext *context)

{
  bitmask<slang::ast::ASTFlags> extraFlags;
  optional<int> value;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppDVar3;
  SequenceExprSyntax *pSVar4;
  undefined4 extraout_var_00;
  uint32_t *puVar5;
  Compilation *this;
  EVP_PKEY_CTX *src;
  sockaddr *in_RSI;
  long in_RDI;
  SourceRange SVar6;
  SourceRange SVar7;
  SequenceRange SVar8;
  SequenceConcatExpr *result;
  Compilation *comp;
  optional<int> val;
  SourceRange delayRange;
  AssertionExpr *seq_1;
  SequenceRange delay_1;
  DelayedSequenceElementSyntax *es;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *__range2;
  SequenceRange delay;
  AssertionExpr *seq;
  SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL> elems;
  bool ok;
  ASTContext *in_stack_fffffffffffffc18;
  Compilation *in_stack_fffffffffffffc20;
  span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *in_stack_fffffffffffffc28;
  ASTContext *in_stack_fffffffffffffc30;
  SourceLocation in_stack_fffffffffffffc38;
  SourceLocation in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  _Storage<int,_true> in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  SourceLocation local_3a8;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  AssertionExpr *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  SourceRange local_2c0;
  not_null<const_slang::ast::AssertionExpr_*> local_2b0;
  SourceLocation local_2a8;
  SourceLocation local_2a0;
  SourceRange local_298;
  undefined8 local_288;
  undefined4 local_280;
  undefined8 local_274;
  undefined4 local_26c;
  SourceRange local_268;
  undefined8 local_258;
  SourceRange local_250;
  _Optional_payload_base<int> local_240;
  bitmask<slang::ast::ASTFlags> local_238;
  _Optional_payload_base<int> local_230;
  SourceRange local_228;
  SourceRange local_218;
  AssertionExpr *local_208;
  uint32_t local_1fc;
  _Storage<unsigned_int,_true> _Stack_1f8;
  undefined4 local_1f4;
  DelayedSequenceElementSyntax *local_1f0;
  DelayedSequenceElementSyntax **local_1e8;
  __normal_iterator<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
  local_1e0;
  long local_1d8;
  AssertionExpr *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  not_null<const_slang::ast::AssertionExpr_*> local_1a8;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 local_190;
  AssertionExpr *local_180;
  SmallVectorBase<slang::ast::SequenceConcatExpr::Element> local_178 [5];
  byte local_19;
  sockaddr *local_18;
  long local_10;
  SequenceConcatExpr *local_8;
  
  local_19 = 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL>::SmallVector
            ((SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL> *)0x94634c);
  if (*(long *)(local_10 + 0x18) != 0) {
    iVar2 = AssertionExpr::bind((int)*(undefined8 *)(local_10 + 0x18),local_18,0);
    local_180 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
    AssertionExpr::requireSequence
              ((AssertionExpr *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    bVar1 = AssertionExpr::bad(local_180);
    local_19 = ~bVar1 & local_19 & 1;
    local_198 = 0;
    local_19c = 0;
    std::optional<unsigned_int>::optional<int,_true>
              ((optional<unsigned_int> *)in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc18)
    ;
    local_1c0 = local_190;
    local_1c8 = CONCAT44(uStack_194,local_198);
    SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffc20);
    local_1d0 = local_180;
    not_null<const_slang::ast::AssertionExpr_*>::not_null<const_slang::ast::AssertionExpr_*>
              (&local_1a8,&local_1d0);
    SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::push_back
              ((SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *)in_stack_fffffffffffffc20
               ,(Element *)in_stack_fffffffffffffc18);
  }
  local_1d8 = local_10 + 0x20;
  local_1e0._M_current =
       (DelayedSequenceElementSyntax **)
       std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffc18);
  local_1e8 = (DelayedSequenceElementSyntax **)
              std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>::end
                        ((span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>
                          *)in_stack_fffffffffffffc28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffc20,
                       (__normal_iterator<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffc18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_1e0);
    local_1f0 = *ppDVar3;
    SequenceRange::SequenceRange((SequenceRange *)0x946529);
    pSVar4 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                       ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x94653a);
    iVar2 = AssertionExpr::bind((int)pSVar4,local_18,0);
    local_208 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar2);
    AssertionExpr::requireSequence
              ((AssertionExpr *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    bVar1 = AssertionExpr::bad(local_208);
    local_19 = ~bVar1 & local_19 & 1;
    SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffc20);
    SVar6.endLoc = local_2a0;
    SVar6.startLoc = local_3a8;
    if (local_1f0->delayVal == (ExpressionSyntax *)0x0) {
      if (local_1f0->range == (SelectorSyntax *)0x0) {
        if ((local_1f0->op).kind == Star) {
          SVar7 = parsing::Token::range((Token *)in_stack_fffffffffffffc40);
          SVar6.endLoc = local_2a0;
          local_1fc = 0;
          local_298 = SVar7;
        }
        else {
          SVar7 = local_218;
          if ((local_1f0->op).kind == Plus) {
            SVar7 = parsing::Token::range((Token *)in_stack_fffffffffffffc40);
            local_2a8 = SVar7.startLoc;
            in_stack_fffffffffffffc50 = SVar7.endLoc._0_4_;
            local_1fc = 1;
            SVar6 = SVar7;
          }
        }
      }
      else {
        SVar6 = slang::syntax::SyntaxNode::sourceRange
                          ((SyntaxNode *)
                           CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
        local_268 = SVar6;
        local_218 = SVar6;
        SVar8 = SequenceRange::fromSyntax
                          ((SelectorSyntax *)
                           CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                           (ASTContext *)SVar6.startLoc,SVar6.endLoc._7_1_);
        SVar6.endLoc = local_2a0;
        local_288 = SVar8._0_8_;
        in_stack_fffffffffffffc77 =
             SVar8.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
        local_280 = CONCAT31(local_280._1_3_,in_stack_fffffffffffffc77);
        local_26c = local_280;
        local_1fc = SVar8.min;
        _Stack_1f8._M_value =
             SVar8.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        local_1f4 = local_280;
        local_274 = local_288;
        SVar7 = local_218;
      }
    }
    else {
      SVar6 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                        );
      local_228 = SVar6;
      local_218 = SVar6;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_238,AssertionDelayOrRepetition);
      extraFlags.m_bits._4_4_ = in_stack_fffffffffffffc4c._M_value;
      extraFlags.m_bits._0_4_ = in_stack_fffffffffffffc48;
      local_240 = (_Optional_payload_base<int>)
                  ASTContext::evalInteger
                            ((ASTContext *)in_stack_fffffffffffffc40,
                             (ExpressionSyntax *)in_stack_fffffffffffffc38,extraFlags);
      local_230 = local_240;
      SVar6 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                        );
      value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
           = in_stack_fffffffffffffc50;
      value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = in_stack_fffffffffffffc4c._M_value;
      SVar7.endLoc = in_stack_fffffffffffffc40;
      SVar7.startLoc = in_stack_fffffffffffffc38;
      local_250 = SVar6;
      in_stack_fffffffffffffc97 = ASTContext::requirePositive(in_stack_fffffffffffffc30,value,SVar7)
      ;
      if ((bool)in_stack_fffffffffffffc97) {
        puVar5 = (uint32_t *)std::optional<int>::operator*((optional<int> *)0x946752);
        local_1fc = *puVar5;
        std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                  ((optional<unsigned_int> *)in_stack_fffffffffffffc20,
                   (uint *)in_stack_fffffffffffffc18);
        _Stack_1f8._M_value = (uint)local_258;
        local_1f4 = (undefined4)((ulong)local_258 >> 0x20);
      }
      else {
        local_19 = 0;
      }
      SVar6.endLoc = local_2a0;
      SVar7 = local_218;
    }
    local_2a0 = SVar6.endLoc;
    local_3a8 = SVar6.startLoc;
    local_2c8 = local_1f4;
    local_2d0 = CONCAT44(_Stack_1f8._M_value,local_1fc);
    local_2d8 = local_208;
    local_218 = SVar7;
    local_2c0 = SVar7;
    not_null<const_slang::ast::AssertionExpr_*>::not_null<const_slang::ast::AssertionExpr_*>
              (&local_2b0,&local_2d8);
    SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::push_back
              ((SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *)in_stack_fffffffffffffc20
               ,(Element *)in_stack_fffffffffffffc18);
    __gnu_cxx::
    __normal_iterator<slang::syntax::DelayedSequenceElementSyntax_**,_std::span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_1e0);
  }
  this = ASTContext::getCompilation((ASTContext *)0x9469d8);
  SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::copy(local_178,(EVP_PKEY_CTX *)this,src)
  ;
  local_8 = BumpAllocator::
            emplace<slang::ast::SequenceConcatExpr,std::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
                      (&this->super_BumpAllocator,in_stack_fffffffffffffc28);
  if ((local_19 & 1) == 0) {
    local_8 = (SequenceConcatExpr *)
              AssertionExpr::badExpr
                        (in_stack_fffffffffffffc20,(AssertionExpr *)in_stack_fffffffffffffc18);
  }
  SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL>::~SmallVector
            ((SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL> *)0x946aba);
  return &local_8->super_AssertionExpr;
}

Assistant:

AssertionExpr& SequenceConcatExpr::fromSyntax(const DelayedSequenceExprSyntax& syntax,
                                              const ASTContext& context) {
    bool ok = true;
    SmallVector<Element, 8> elems;
    if (syntax.first) {
        auto& seq = bind(*syntax.first, context);
        seq.requireSequence(context);
        ok &= !seq.bad();

        SequenceRange delay{0, 0};
        elems.push_back({delay, SourceRange{}, &seq});
    }

    for (auto es : syntax.elements) {
        SequenceRange delay;
        auto& seq = bind(*es->expr, context);
        seq.requireSequence(context);
        ok &= !seq.bad();

        SourceRange delayRange;
        if (es->delayVal) {
            delayRange = es->delayVal->sourceRange();
            auto val = context.evalInteger(*es->delayVal, ASTFlags::AssertionDelayOrRepetition);
            if (!context.requirePositive(val, es->delayVal->sourceRange()))
                ok = false;
            else
                delay.max = delay.min = uint32_t(*val);
        }
        else if (es->range) {
            delayRange = es->range->sourceRange();
            delay = SequenceRange::fromSyntax(*es->range, context,
                                              /* allowUnbounded */ true);
        }
        else if (es->op.kind == TokenKind::Star) {
            delayRange = es->op.range();
            delay.min = 0;
        }
        else if (es->op.kind == TokenKind::Plus) {
            delayRange = es->op.range();
            delay.min = 1;
        }

        elems.push_back(Element{delay, delayRange, &seq});
    }

    auto& comp = context.getCompilation();
    auto result = comp.emplace<SequenceConcatExpr>(elems.copy(comp));
    if (!ok)
        return badExpr(comp, result);

    return *result;
}